

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O3

wchar_t header_common(archive_read *a,tar *tar,archive_entry *entry,void *h)

{
  byte bVar1;
  int iVar2;
  wchar_t wVar3;
  int64_t iVar4;
  ulong uVar5;
  wchar_t *pwVar6;
  la_int64_t lVar7;
  char *pcVar8;
  uint uVar9;
  archive_string_conv *sconv;
  wchar_t wVar10;
  archive_string local_48;
  
  iVar4 = tar_atol((char *)((long)h + 100),8);
  archive_entry_set_filetype(entry,(uint)iVar4);
  wVar3 = archive_entry_perm_is_set(entry);
  if (wVar3 == L'\0') {
    iVar4 = tar_atol((char *)((long)h + 100),8);
    archive_entry_set_perm(entry,(mode_t)iVar4);
  }
  wVar3 = archive_entry_uid_is_set(entry);
  if (wVar3 == L'\0') {
    iVar4 = tar_atol((char *)((long)h + 0x6c),8);
    archive_entry_set_uid(entry,iVar4);
  }
  wVar3 = archive_entry_gid_is_set(entry);
  if (wVar3 == L'\0') {
    iVar4 = tar_atol((char *)((long)h + 0x74),8);
    archive_entry_set_gid(entry,iVar4);
  }
  wVar3 = archive_entry_mtime_is_set(entry);
  if (wVar3 == L'\0') {
    iVar4 = tar_atol((char *)((long)h + 0x88),0xc);
    archive_entry_set_mtime(entry,iVar4,0);
  }
  bVar1 = tar->size_fields;
  if ((bVar1 & 2) == 0) {
    if (((bVar1 & 4) != 0) && (tar->sparse_gnu_major == 0)) {
      uVar5 = tar->GNU_sparse_size;
      goto LAB_00253f61;
    }
    if ((bVar1 & 8) != 0) {
      uVar5 = tar->SCHILY_sparse_realsize;
      goto LAB_00253f61;
    }
    if ((bVar1 & 1) != 0) {
      uVar5 = tar->pax_size;
      goto LAB_00253f61;
    }
    uVar5 = tar_atol((char *)((long)h + 0x7c),0xc);
    tar->disk_size = uVar5;
  }
  else {
    uVar5 = tar->GNU_sparse_realsize;
LAB_00253f61:
    tar->disk_size = uVar5;
  }
  if ((long)uVar5 < 0) {
    pcVar8 = "Tar entry has negative file size";
    goto LAB_00254000;
  }
  if (uVar5 >> 0x3c != 0) {
LAB_00253fe5:
    pcVar8 = "Tar entry size overflow";
LAB_00254000:
    archive_set_error(&a->archive,-1,pcVar8);
    return L'\xffffffe2';
  }
  archive_entry_set_size(entry,uVar5);
  wVar3 = (wchar_t)uVar5;
  if (((tar->size_fields & 4U) == 0) || (tar->sparse_gnu_major != 1)) {
    if ((tar->size_fields & 1U) == 0) {
      wVar3 = L'\f';
      uVar5 = tar_atol((char *)((long)h + 0x7c),0xc);
    }
    else {
      uVar5 = tar->pax_size;
    }
  }
  else {
    uVar5 = tar->GNU_sparse_size;
  }
  tar->entry_bytes_remaining = uVar5;
  if ((long)uVar5 < 0) {
    tar->entry_bytes_remaining = 0;
    pcVar8 = "Tar entry has negative size";
    goto LAB_00254000;
  }
  if (0xfffffffffffffff < uVar5) {
    tar->entry_bytes_remaining = 0;
    goto LAB_00253fe5;
  }
  bVar1 = *(byte *)((long)h + 0x9c);
  tar->filetype = bVar1;
  if (0x43 < bVar1) {
    if (bVar1 == 0x44) {
      uVar9 = 0x4000;
      goto LAB_002540c3;
    }
    if (bVar1 == 0x4d) {
      return L'\0';
    }
switchD_00254053_default:
    uVar9 = 0x8000;
LAB_002540c3:
    archive_entry_set_filetype(entry,uVar9);
    return L'\0';
  }
  switch(bVar1) {
  case 0x31:
    archive_entry_set_link_to_hardlink(entry);
    pwVar6 = archive_entry_hardlink_w(entry);
    pcVar8 = archive_entry_hardlink(entry);
    if (((pcVar8 == (char *)0x0) || (*pcVar8 == '\0')) &&
       ((pwVar6 == (wchar_t *)0x0 || (*pwVar6 == L'\0')))) {
      local_48.s = (char *)0x0;
      local_48.length = 0;
      local_48.buffer_length = 0;
      archive_strncat(&local_48,(void *)((long)h + 0x9d),100);
      pcVar8 = local_48.s;
      wVar10 = _archive_entry_copy_hardlink_l(entry,local_48.s,local_48.length,tar->sconv);
      wVar3 = (wchar_t)pcVar8;
      if (wVar10 == L'\0') {
        wVar10 = L'\0';
      }
      else {
        sconv = tar->sconv;
        wVar10 = set_conversion_failed_error(a,sconv,"Linkname");
        wVar3 = (wchar_t)sconv;
        if (wVar10 == L'\xffffffe2') {
LAB_00254220:
          archive_string_free(&local_48);
          return L'\xffffffe2';
        }
      }
      archive_string_free(&local_48);
    }
    else {
      wVar10 = L'\0';
    }
    lVar7 = archive_entry_size(entry);
    if (0 < lVar7) {
      wVar3 = L'耀';
      archive_entry_set_filetype(entry,0x8000);
    }
    lVar7 = archive_entry_size(entry);
    if (lVar7 == 0) {
      return wVar10;
    }
    iVar2 = (a->archive).archive_format;
    if (iVar2 != 0x30004) {
      if (iVar2 == 0x30002) {
        return wVar10;
      }
      if ((iVar2 != 0x30000) && (wVar3 = archive_read_format_tar_bid(a,wVar3), wVar3 < L'3')) {
        return wVar10;
      }
    }
    goto LAB_00254132;
  case 0x32:
    archive_entry_set_link_to_symlink(entry);
    pwVar6 = archive_entry_symlink_w(entry);
    pcVar8 = archive_entry_symlink(entry);
    if (((pcVar8 == (char *)0x0) || (*pcVar8 == '\0')) &&
       ((pwVar6 == (wchar_t *)0x0 || (*pwVar6 == L'\0')))) {
      local_48.s = (char *)0x0;
      local_48.length = 0;
      local_48.buffer_length = 0;
      archive_strncat(&local_48,(void *)((long)h + 0x9d),100);
      wVar3 = _archive_entry_copy_symlink_l(entry,local_48.s,local_48.length,tar->sconv);
      if (wVar3 == L'\0') {
        wVar10 = L'\0';
      }
      else {
        wVar10 = set_conversion_failed_error(a,tar->sconv,"Linkname");
        if (wVar10 == L'\xffffffe2') goto LAB_00254220;
      }
      archive_string_free(&local_48);
    }
    else {
      wVar10 = L'\0';
    }
    archive_entry_set_filetype(entry,0xa000);
    goto LAB_00254132;
  case 0x33:
    uVar9 = 0x2000;
    break;
  case 0x34:
    uVar9 = 0x6000;
    break;
  case 0x35:
    uVar9 = 0x4000;
    break;
  case 0x36:
    uVar9 = 0x1000;
    break;
  default:
    goto switchD_00254053_default;
  }
  archive_entry_set_filetype(entry,uVar9);
  wVar10 = L'\0';
LAB_00254132:
  archive_entry_set_size(entry,0);
  tar->entry_bytes_remaining = 0;
  return wVar10;
}

Assistant:

static int
header_common(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, const void *h)
{
	const struct archive_entry_header_ustar	*header;
	const char *existing_linkpath;
	const wchar_t *existing_wcs_linkpath;
	int     err = ARCHIVE_OK;

	header = (const struct archive_entry_header_ustar *)h;

	/* Parse out the numeric fields (all are octal) */

	/* Split mode handling: Set filetype always, perm only if not already set */
	archive_entry_set_filetype(entry,
	    (mode_t)tar_atol(header->mode, sizeof(header->mode)));
	if (!archive_entry_perm_is_set(entry)) {
		archive_entry_set_perm(entry,
			(mode_t)tar_atol(header->mode, sizeof(header->mode)));
	}

	/* Set uid, gid, mtime if not already set */
	if (!archive_entry_uid_is_set(entry)) {
		archive_entry_set_uid(entry, tar_atol(header->uid, sizeof(header->uid)));
	}
	if (!archive_entry_gid_is_set(entry)) {
		archive_entry_set_gid(entry, tar_atol(header->gid, sizeof(header->gid)));
	}
	if (!archive_entry_mtime_is_set(entry)) {
		archive_entry_set_mtime(entry, tar_atol(header->mtime, sizeof(header->mtime)), 0);
	}

	/* Reconcile the size info. */
	/* First, how big is the file on disk? */
	if ((tar->size_fields & TAR_SIZE_GNU_SPARSE_REALSIZE) != 0) {
		/* GNU sparse format 1.0 uses `GNU.sparse.realsize`
		 * to hold the size of the file on disk. */
		tar->disk_size = tar->GNU_sparse_realsize;
	} else if ((tar->size_fields & TAR_SIZE_GNU_SPARSE_SIZE) != 0
		   && (tar->sparse_gnu_major == 0)) {
		/* GNU sparse format 0.0 and 0.1 use `GNU.sparse.size`
		 * to hold the size of the file on disk. */
		tar->disk_size = tar->GNU_sparse_size;
	} else if ((tar->size_fields & TAR_SIZE_SCHILY_SPARSE_REALSIZE) != 0) {
		tar->disk_size = tar->SCHILY_sparse_realsize;
	} else if ((tar->size_fields & TAR_SIZE_PAX_SIZE) != 0) {
		tar->disk_size = tar->pax_size;
	} else {
		/* There wasn't a suitable pax header, so use the ustar info */
		tar->disk_size = tar_atol(header->size, sizeof(header->size));
	}

	if (tar->disk_size < 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
				  "Tar entry has negative file size");
		return (ARCHIVE_FATAL);
	} else if (tar->disk_size > entry_limit) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
				  "Tar entry size overflow");
		return (ARCHIVE_FATAL);
	} else {
		archive_entry_set_size(entry, tar->disk_size);
	}

	/* Second, how big is the data in the archive? */
	if ((tar->size_fields & TAR_SIZE_GNU_SPARSE_SIZE) != 0
	    && (tar->sparse_gnu_major == 1)) {
		/* GNU sparse format 1.0 uses `GNU.sparse.size`
		 * to hold the size of the data in the archive. */
		tar->entry_bytes_remaining = tar->GNU_sparse_size;
	} else if ((tar->size_fields & TAR_SIZE_PAX_SIZE) != 0) {
		tar->entry_bytes_remaining = tar->pax_size;
	} else {
		tar->entry_bytes_remaining
			= tar_atol(header->size, sizeof(header->size));
	}
	if (tar->entry_bytes_remaining < 0) {
		tar->entry_bytes_remaining = 0;
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
				  "Tar entry has negative size");
		return (ARCHIVE_FATAL);
	} else if (tar->entry_bytes_remaining > entry_limit) {
		tar->entry_bytes_remaining = 0;
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
				  "Tar entry size overflow");
		return (ARCHIVE_FATAL);
	}

	/* Handle the tar type flag appropriately. */
	tar->filetype = header->typeflag[0];

	/*
	 * TODO: If the linkpath came from Pax extension header, then
	 * we should obey the hdrcharset_utf8 flag when converting these.
	 */
	switch (tar->filetype) {
	case '1': /* Hard link */
		archive_entry_set_link_to_hardlink(entry);
		existing_wcs_linkpath = archive_entry_hardlink_w(entry);
		existing_linkpath = archive_entry_hardlink(entry);
		if ((existing_linkpath == NULL || existing_linkpath[0] == '\0')
		    && (existing_wcs_linkpath == NULL || existing_wcs_linkpath[0] == '\0')) {
			struct archive_string linkpath;
			archive_string_init(&linkpath);
			archive_strncpy(&linkpath,
					header->linkname, sizeof(header->linkname));
			if (archive_entry_copy_hardlink_l(entry, linkpath.s,
							  archive_strlen(&linkpath), tar->sconv) != 0) {
				err = set_conversion_failed_error(a, tar->sconv,
								  "Linkname");
				if (err == ARCHIVE_FATAL) {
					archive_string_free(&linkpath);
					return (err);
				}
			}
			archive_string_free(&linkpath);
		}
		/*
		 * The following may seem odd, but: Technically, tar
		 * does not store the file type for a "hard link"
		 * entry, only the fact that it is a hard link.  So, I
		 * leave the type zero normally.  But, pax interchange
		 * format allows hard links to have data, which
		 * implies that the underlying entry is a regular
		 * file.
		 */
		if (archive_entry_size(entry) > 0)
			archive_entry_set_filetype(entry, AE_IFREG);

		/*
		 * A tricky point: Traditionally, tar readers have
		 * ignored the size field when reading hardlink
		 * entries, and some writers put non-zero sizes even
		 * though the body is empty.  POSIX blessed this
		 * convention in the 1988 standard, but broke with
		 * this tradition in 2001 by permitting hardlink
		 * entries to store valid bodies in pax interchange
		 * format, but not in ustar format.  Since there is no
		 * hard and fast way to distinguish pax interchange
		 * from earlier archives (the 'x' and 'g' entries are
		 * optional, after all), we need a heuristic.
		 */
		if (archive_entry_size(entry) == 0) {
			/* If the size is already zero, we're done. */
		}  else if (a->archive.archive_format
		    == ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE) {
			/* Definitely pax extended; must obey hardlink size. */
		} else if (a->archive.archive_format == ARCHIVE_FORMAT_TAR
		    || a->archive.archive_format == ARCHIVE_FORMAT_TAR_GNUTAR)
		{
			/* Old-style or GNU tar: we must ignore the size. */
			archive_entry_set_size(entry, 0);
			tar->entry_bytes_remaining = 0;
		} else if (archive_read_format_tar_bid(a, 50) > 50) {
			/*
			 * We don't know if it's pax: If the bid
			 * function sees a valid ustar header
			 * immediately following, then let's ignore
			 * the hardlink size.
			 */
			archive_entry_set_size(entry, 0);
			tar->entry_bytes_remaining = 0;
		}
		/*
		 * TODO: There are still two cases I'd like to handle:
		 *   = a ustar non-pax archive with a hardlink entry at
		 *     end-of-archive.  (Look for block of nulls following?)
		 *   = a pax archive that has not seen any pax headers
		 *     and has an entry which is a hardlink entry storing
		 *     a body containing an uncompressed tar archive.
		 * The first is worth addressing; I don't see any reliable
		 * way to deal with the second possibility.
		 */
		break;
	case '2': /* Symlink */
		archive_entry_set_link_to_symlink(entry);
		existing_wcs_linkpath = archive_entry_symlink_w(entry);
		existing_linkpath = archive_entry_symlink(entry);
		if ((existing_linkpath == NULL || existing_linkpath[0] == '\0')
		    && (existing_wcs_linkpath == NULL || existing_wcs_linkpath[0] == '\0')) {
			struct archive_string linkpath;
			archive_string_init(&linkpath);
			archive_strncpy(&linkpath,
					header->linkname, sizeof(header->linkname));
			if (archive_entry_copy_symlink_l(entry, linkpath.s,
			    archive_strlen(&linkpath), tar->sconv) != 0) {
				err = set_conversion_failed_error(a, tar->sconv,
				    "Linkname");
				if (err == ARCHIVE_FATAL) {
					archive_string_free(&linkpath);
					return (err);
				}
			}
			archive_string_free(&linkpath);
		}
		archive_entry_set_filetype(entry, AE_IFLNK);
		archive_entry_set_size(entry, 0);
		tar->entry_bytes_remaining = 0;
		break;
	case '3': /* Character device */
		archive_entry_set_filetype(entry, AE_IFCHR);
		archive_entry_set_size(entry, 0);
		tar->entry_bytes_remaining = 0;
		break;
	case '4': /* Block device */
		archive_entry_set_filetype(entry, AE_IFBLK);
		archive_entry_set_size(entry, 0);
		tar->entry_bytes_remaining = 0;
		break;
	case '5': /* Dir */
		archive_entry_set_filetype(entry, AE_IFDIR);
		archive_entry_set_size(entry, 0);
		tar->entry_bytes_remaining = 0;
		break;
	case '6': /* FIFO device */
		archive_entry_set_filetype(entry, AE_IFIFO);
		archive_entry_set_size(entry, 0);
		tar->entry_bytes_remaining = 0;
		break;
	case 'D': /* GNU incremental directory type */
		/*
		 * No special handling is actually required here.
		 * It might be nice someday to preprocess the file list and
		 * provide it to the client, though.
		 */
		archive_entry_set_filetype(entry, AE_IFDIR);
		break;
	case 'M': /* GNU "Multi-volume" (remainder of file from last archive)*/
		/*
		 * As far as I can tell, this is just like a regular file
		 * entry, except that the contents should be _appended_ to
		 * the indicated file at the indicated offset.  This may
		 * require some API work to fully support.
		 */
		break;
	case 'N': /* Old GNU "long filename" entry. */
		/* The body of this entry is a script for renaming
		 * previously-extracted entries.  Ugh.  It will never
		 * be supported by libarchive. */
		archive_entry_set_filetype(entry, AE_IFREG);
		break;
	case 'S': /* GNU sparse files */
		/*
		 * Sparse files are really just regular files with
		 * sparse information in the extended area.
		 */
		/* FALLTHROUGH */
	case '0': /* ustar "regular" file */
		/* FALLTHROUGH */
	default: /* Non-standard file types */
		/*
		 * Per POSIX: non-recognized types should always be
		 * treated as regular files.
		 */
		archive_entry_set_filetype(entry, AE_IFREG);
		break;
	}
	return (err);
}